

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

iterator __thiscall re2::SparseArray<int>::set(SparseArray<int> *this,int i,int v)

{
  bool bVar1;
  iterator iVar2;
  
  DebugCheckInvariants(this);
  if ((uint)i < (uint)this->max_size_) {
    bVar1 = has_index(this,i);
    if (!bVar1) {
      create_index(this,i);
    }
    iVar2 = set_existing(this,i,v);
    return (iterator)iVar2._M_current;
  }
  return (iterator)
         (this->dense_).
         super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
         ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

typename SparseArray<Value>::iterator SparseArray<Value>::set(int i, Value v) {
  DebugCheckInvariants();
  if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
    // Semantically, end() would be better here, but we already know
    // the user did something stupid, so begin() insulates them from
    // dereferencing an invalid pointer.
    return begin();
  }
  if (!has_index(i))
    create_index(i);
  return set_existing(i, v);
}